

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_round_to_int_m68k(float128 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  flag fVar3;
  int32_t iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong a1;
  float128 fVar8;
  ulong local_70;
  uint64_t uStack_58;
  float128 z;
  uint64_t roundBitsMask;
  uint64_t lastBitMask;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  uint64_t local_10;
  
  uVar5 = a.high;
  a1 = a.low;
  iVar4 = extractFloat128Exp(a);
  lastBitMask._0_1_ = (char)iVar4;
  z.low = uVar5;
  if (iVar4 < 0x402f) {
    if (iVar4 < 0x3fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 &&
          a1 == 0) {
        return a;
      }
      status->float_exception_flags = status->float_exception_flags | 0x20;
      fVar3 = extractFloat128Sign(a);
      switch(status->float_rounding_mode) {
      case '\0':
        if (iVar4 == 0x3ffe) {
          uVar5 = extractFloat128Frac0(a);
          uVar6 = extractFloat128Frac1(a);
          if (uVar5 != 0 || uVar6 != 0) {
            fVar8 = packFloat128(fVar3,0x3fff,0,0);
            return fVar8;
          }
        }
        break;
      case '\x01':
        if (fVar3 != '\0') {
          fVar8 = packFloat128('\x01',0x3fff,0,0);
          return fVar8;
        }
        fVar8 = packFloat128('\0',0,0,0);
        return fVar8;
      case '\x02':
        if (fVar3 != '\0') {
          fVar8 = packFloat128('\x01',0,0,0);
          return fVar8;
        }
        fVar8 = packFloat128('\0',0x3fff,0,0);
        return fVar8;
      case '\x04':
        if (iVar4 == 0x3ffe) {
          fVar8 = packFloat128(fVar3,0x3fff,0,0);
          return fVar8;
        }
        break;
      case '\x05':
        fVar8 = packFloat128(fVar3,0x3fff,0,0);
        return fVar8;
      }
      fVar8 = packFloat128(fVar3,0,0,0);
      return fVar8;
    }
    uVar7 = 1L << (0x2fU - (char)lastBitMask & 0x3f);
    z.high = uVar7 - 1;
    uStack_58 = 0;
    switch(status->float_rounding_mode) {
    case '\0':
      z.low = (uVar7 >> 1) + uVar5;
      if ((z.low & z.high) == 0 && a1 == 0) {
        z.low = (uVar7 ^ 0xffffffffffffffff) & z.low;
      }
      break;
    case '\x01':
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      fVar3 = extractFloat128Sign((float128)(auVar2 << 0x40));
      if (fVar3 != '\0') {
        z.low = z.high + ((long)(int)(uint)(a1 != 0) | z.low);
      }
      break;
    case '\x02':
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      fVar3 = extractFloat128Sign((float128)(auVar1 << 0x40));
      if (fVar3 == '\0') {
        z.low = z.high + ((long)(int)(uint)(a1 != 0) | z.low);
      }
      break;
    case '\x03':
      break;
    case '\x04':
      z.low = (uVar7 >> 1) + uVar5;
      break;
    case '\x05':
      if ((uVar5 & uVar7) == 0) {
        z.low = z.high + ((long)(int)(uint)(a1 != 0) | uVar5);
      }
      break;
    default:
      abort();
    }
    z.low = (z.high ^ 0xffffffffffffffff) & z.low;
  }
  else {
    if (0x406e < iVar4) {
      if (iVar4 != 0x7fff) {
        return a;
      }
      uVar5 = extractFloat128Frac0(a);
      uVar6 = extractFloat128Frac1(a);
      if (uVar5 == 0 && uVar6 == 0) {
        return a;
      }
      fVar8 = propagateFloat128NaN(a,a,status);
      return fVar8;
    }
    uVar7 = 1L << (0x6eU - (char)lastBitMask & 0x3f);
    local_70 = uVar7 * 2;
    z.high = local_70 - 1;
    uStack_58 = a1;
    switch(status->float_rounding_mode) {
    case '\0':
      if (local_70 == 0) {
        if (((long)a1 < 0) &&
           (z.low = uVar5 + 1,
           ((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)) {
          z.low = z.low & 0xfffffffffffffffe;
        }
      }
      else {
        add128(uVar5,a1,0,uVar7 & 0x7fffffffffffffff,&z.low,&uStack_58);
        if ((uStack_58 & z.high) == 0) {
          uStack_58 = (local_70 ^ 0xffffffffffffffff) & uStack_58;
        }
      }
      break;
    case '\x01':
      fVar3 = extractFloat128Sign(a);
      if (fVar3 != '\0') {
        add128(z.low,uStack_58,0,z.high,&z.low,&uStack_58);
      }
      break;
    case '\x02':
      fVar3 = extractFloat128Sign(a);
      if (fVar3 == '\0') {
        add128(z.low,uStack_58,0,z.high,&z.low,&uStack_58);
      }
      break;
    case '\x03':
      break;
    case '\x04':
      if (local_70 == 0) {
        if ((long)a1 < 0) {
          z.low = uVar5 + 1;
        }
      }
      else {
        add128(uVar5,a1,0,uVar7 & 0x7fffffffffffffff,&z.low,&uStack_58);
      }
      break;
    case '\x05':
      if (local_70 == 0) {
        local_70 = uVar5 & 1;
      }
      else {
        local_70 = a1 & local_70;
      }
      if (local_70 == 0) {
        add128(uVar5,a1,0,z.high,&z.low,&uStack_58);
      }
      break;
    default:
      abort();
    }
    uStack_58 = (z.high ^ 0xffffffffffffffff) & uStack_58;
  }
  if ((uStack_58 != a1) || (z.low != uVar5)) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  local_10 = z.low;
  a_local.high = uStack_58;
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_round_to_int(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t lastBitMask, roundBitsMask;
    float128 z;

    aExp = extractFloat128Exp( a );
    if ( 0x402F <= aExp ) {
        if ( 0x406F <= aExp ) {
            if (    ( aExp == 0x7FFF )
                 && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) )
               ) {
                return propagateFloat128NaN(a, a, status);
            }
            return a;
        }
        lastBitMask = 1;
        lastBitMask = ( lastBitMask<<( 0x406E - aExp ) )<<1;
        roundBitsMask = lastBitMask - 1;
        z = a;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            if ( lastBitMask ) {
                add128( z.high, z.low, 0, lastBitMask>>1, &z.high, &z.low );
                if ( ( z.low & roundBitsMask ) == 0 ) z.low &= ~ lastBitMask;
            }
            else {
                if ( (int64_t) z.low < 0 ) {
                    ++z.high;
                    if ( (uint64_t) ( z.low<<1 ) == 0 ) z.high &= ~1;
                }
            }
            break;
        case float_round_ties_away:
            if (lastBitMask) {
                add128(z.high, z.low, 0, lastBitMask >> 1, &z.high, &z.low);
            } else {
                if ((int64_t) z.low < 0) {
                    ++z.high;
                }
            }
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_to_odd:
            /*
             * Note that if lastBitMask == 0, the last bit is the lsb
             * of high, and roundBitsMask == -1.
             */
            if ((lastBitMask ? z.low & lastBitMask : z.high & 1) == 0) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        default:
            abort();
        }
        z.low &= ~ roundBitsMask;
    }
    else {
        if ( aExp < 0x3FFF ) {
            if ( ( ( (uint64_t) ( a.high<<1 ) ) | a.low ) == 0 ) return a;
            status->float_exception_flags |= float_flag_inexact;
            aSign = extractFloat128Sign( a );
            switch (status->float_rounding_mode) {
            case float_round_nearest_even:
                if (    ( aExp == 0x3FFE )
                     && (   extractFloat128Frac0( a )
                          | extractFloat128Frac1( a ) )
                   ) {
                    return packFloat128( aSign, 0x3FFF, 0, 0 );
                }
                break;
            case float_round_ties_away:
                if (aExp == 0x3FFE) {
                    return packFloat128(aSign, 0x3FFF, 0, 0);
                }
                break;
            case float_round_down:
                return
                      aSign ? packFloat128( 1, 0x3FFF, 0, 0 )
                    : packFloat128( 0, 0, 0, 0 );
            case float_round_up:
                return
                      aSign ? packFloat128( 1, 0, 0, 0 )
                    : packFloat128( 0, 0x3FFF, 0, 0 );

            case float_round_to_odd:
                return packFloat128(aSign, 0x3FFF, 0, 0);
            }
            return packFloat128( aSign, 0, 0, 0 );
        }
        lastBitMask = 1;
        lastBitMask <<= 0x402F - aExp;
        roundBitsMask = lastBitMask - 1;
        z.low = 0;
        z.high = a.high;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            z.high += lastBitMask>>1;
            if ( ( ( z.high & roundBitsMask ) | a.low ) == 0 ) {
                z.high &= ~ lastBitMask;
            }
            break;
        case float_round_ties_away:
            z.high += lastBitMask>>1;
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                z.high |= ( a.low != 0 );
                z.high += roundBitsMask;
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        case float_round_to_odd:
            if ((z.high & lastBitMask) == 0) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        default:
            abort();
        }
        z.high &= ~ roundBitsMask;
    }
    if ( ( z.low != a.low ) || ( z.high != a.high ) ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}